

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSetInner::ToComplement
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint base,
          CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  undefined4 *local_40;
  
  uVar8 = (ulong)base;
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *local_40 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x228,"(level > 0)","level > 0");
    if (!bVar3) {
LAB_00e59ab1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_40 = 0;
  }
  else {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  uVar9 = -1 << ((char)level * '\x04' + 4U & 0x1f);
  iVar4 = ~uVar9 + base;
  lVar5 = 0;
  do {
    pCVar1 = this->children[lVar5];
    uVar7 = (uint)uVar8;
    if (pCVar1 == (CharSetNode *)0x0) {
      uVar6 = 0x100;
      if (0x100 < uVar7) {
        uVar6 = uVar8;
      }
      if (0xffff < uVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar3) goto LAB_00e59ab1;
        *local_40 = 0;
      }
      if (0xffff < ~uVar9 + uVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar3) goto LAB_00e59ab1;
        *local_40 = 0;
      }
      CharSet<char16_t>::SetRange(result,allocator,(Char)uVar6,(Char)iVar4);
    }
    else {
      (*pCVar1->_vptr_CharSetNode[6])(pCVar1,allocator,(ulong)(level - 1),uVar8,result);
    }
    uVar8 = (ulong)(uVar7 - uVar9);
    lVar5 = lVar5 + 1;
    iVar4 = iVar4 - uVar9;
    if (lVar5 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void CharSetInner::ToComplement(ArenaAllocator* allocator, uint level, uint base, CharSet<Char>& result) const
    {
        Assert(level > 0);
        level--;
        uint delta = lim(level) + 1;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] == nullptr)
                // Caution: Part of the range for this child may overlap with direct vector
                result.SetRange(allocator, UTC(max(base, directSize)), UTC(base + delta - 1));
            else
                children[i]->ToComplement(allocator, level, base, result);
            base += delta;
        }
    }